

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

void kratos::Var::move_src_to(Var *var,Var *new_var,Generator *parent,bool keep_connection)

{
  long *plVar1;
  int iVar2;
  undefined4 extraout_var;
  Generator *pGVar3;
  long lVar4;
  undefined4 extraout_var_00;
  VarException *this;
  undefined8 *puVar5;
  initializer_list<const_kratos::IRNode_*> __l;
  Var *local_98;
  Var *local_90;
  shared_ptr<kratos::Stmt> local_88;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_78;
  Var *local_60;
  undefined1 local_58 [8];
  shared_ptr<kratos::AssignStmt> stmt;
  allocator_type local_31;
  
  local_60 = var;
  if ((var->type_ | Slice) != ConstValue) {
    iVar2 = (*(var->super_IRNode)._vptr_IRNode[0x10])();
    for (puVar5 = *(undefined8 **)(CONCAT44(extraout_var,iVar2) + 0x10); puVar5 != (undefined8 *)0x0
        ; puVar5 = (undefined8 *)*puVar5) {
      pGVar3 = Stmt::generator_parent((Stmt *)puVar5[1]);
      if (pGVar3 == parent) {
        plVar1 = puVar5 + 1;
        stmt_set_left((AssignStmt *)*plVar1,var,new_var);
        if (parent->debug == true) {
          local_58 = (undefined1  [8])0x245a90;
          stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
               0x658;
          std::
          vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
          ::emplace_back<std::pair<char_const*,int>>
                    ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                      *)(*plVar1 + 8),(pair<const_char_*,_int> *)local_58);
        }
        (*(new_var->super_IRNode)._vptr_IRNode[0x16])(new_var);
        plVar1 = *(long **)(*(long *)(*plVar1 + 200) + 0x1e8);
        if ((plVar1 != (long *)0x0) && (new_var->width_param_ == (Var *)0x0)) {
          lVar4 = (**(code **)(*plVar1 + 0x68))();
          iVar2 = (*(new_var->super_IRNode)._vptr_IRNode[0xd])(new_var);
          var = local_60;
          if (lVar4 == CONCAT44(extraout_var_00,iVar2)) {
            (*(new_var->super_IRNode)._vptr_IRNode[0x23])(new_var);
          }
        }
      }
    }
    (*(var->super_IRNode)._vptr_IRNode[0x12])(var,0);
    if (keep_connection) {
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_78,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &new_var->super_enable_shared_from_this<kratos::Var>);
      (*(var->super_IRNode)._vptr_IRNode[0x2a])
                (local_58,var,(__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_78,2);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          CONCAT44(local_78.
                   super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                   (int)local_78.
                        super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(local_78.
                            super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                            (int)local_78.
                                 super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish));
      }
      if (parent->debug == true) {
        local_78.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x245a90;
        local_78.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x668;
        std::
        vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
        ::emplace_back<std::pair<char_const*,int>>
                  ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                    *)((long)local_58 + 8),(pair<const_char_*,_int> *)&local_78);
      }
      local_88.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           CONCAT44(stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                    _4_4_,stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr._0_4_);
      local_88.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_58;
      if (local_88.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_88.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_88.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_88.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_88.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      Generator::add_stmt(parent,&local_88);
      if (local_88.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          CONCAT44(stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                   _4_4_,stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._4_4_,
                            stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._0_4_));
      }
    }
    return;
  }
  this = (VarException *)__cxa_allocate_exception(0x10);
  local_58 = (undefined1  [8])
             &stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Only base or port variables are allowed.","");
  local_98 = local_60;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_98;
  local_90 = new_var;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_78,__l,&local_31);
  VarException::VarException(this,(string *)local_58,&local_78);
  __cxa_throw(this,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Var::move_src_to(Var *var, Var *new_var, Generator *parent, bool keep_connection) {
    // only base and port vars are allowed
    if (var->type_ == VarType::Expression || var->type_ == VarType::ConstValue)
        throw VarException("Only base or port variables are allowed.", {var, new_var});

    for (const auto &stmt : var->sources()) {
        if (stmt->generator_parent() != parent) continue;
        stmt_set_left(stmt.get(), var, new_var);
        if (parent->debug) {
            stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        }
        new_var->add_source(stmt);
        // pick a source parameter, if any. only if the generator match
        if (stmt->right()->parametrized() && !new_var->parametrized() &&
            stmt->right()->width_param()->generator() == new_var->generator()) {
            new_var->set_width_param(stmt->right()->width_param());
        }
    }
    // now clear the sources
    var->clear_sources(false);

    if (keep_connection) {
        // create an assignment and add it to the parent
        auto stmt = var->assign(new_var->shared_from_this());
        if (parent->debug) {
            stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        }
        parent->add_stmt(stmt);
    }
}